

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O3

void __thiscall capnp::TextCodec::decode(TextCodec *this,StringPtr input,Builder output)

{
  uint uVar1;
  ElementCount index;
  uint uVar2;
  uint uVar3;
  word **ppwVar4;
  Builder result;
  Builder builder;
  Reader assignments;
  int iVar5;
  BuilderArena *pBVar6;
  word **ppwVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Orphanage orphanageParam;
  ArrayPtr<const_char> input_00;
  Fault f_2;
  ParserInput parserInput;
  ThrowingErrorReporter errorReporter;
  ValueTranslator translator;
  ExternalResolver nullResolver;
  ThrowingErrorReporter errorReporter_1;
  Fault f;
  Fault f_1;
  Builder lexedTokens;
  Reader tokens;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  undefined1 local_4a8 [12];
  undefined4 uStack_49c;
  Exception *local_498;
  WirePointer *pWStack_490;
  WirePointer *local_488;
  size_t sStack_480;
  bool local_478;
  Builder local_468;
  Exception *local_450;
  ElementCount local_448;
  short local_444;
  Exception *local_440;
  uint local_438;
  WirePointer *local_430;
  ErrorReporter local_428;
  char *local_420;
  size_t local_418;
  ValueTranslator local_410;
  Resolver local_3f0;
  char local_3e8;
  OrphanBuilder local_3e0;
  ErrorReporter local_3c0;
  char *local_3b8;
  size_t local_3b0;
  StructReader local_3a8;
  ListReader local_378;
  undefined8 local_348;
  undefined8 uStack_340;
  StructBuilder local_338;
  StructBuilder local_310;
  undefined1 local_2e8 [48];
  MallocMessageBuilder local_2b8;
  CapnpParser local_1c8;
  
  sVar8 = input.content.size_;
  pcVar10 = input.content.ptr;
  local_428._vptr_ErrorReporter = (_func_int **)&PTR_addError_006d4ea0;
  local_420 = pcVar10;
  local_418 = sVar8;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)(local_2e8 + 0x30),0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_468,(MessageBuilder *)(local_2e8 + 0x30));
  local_1c8.orphanage.arena = (BuilderArena *)local_468.builder.segment;
  local_1c8.orphanage.capTable = local_468.builder.capTable;
  capnp::_::PointerBuilder::initStruct(&local_310,(PointerBuilder *)&local_1c8,(StructSize)0x10000);
  result._builder.capTable = local_310.capTable;
  result._builder.segment = local_310.segment;
  result._builder.data = local_310.data;
  result._builder.pointers = local_310.pointers;
  result._builder.dataSize = local_310.dataSize;
  result._builder.pointerCount = local_310.pointerCount;
  result._builder._38_2_ = local_310._38_2_;
  input_00.size_ = sVar8 - 1;
  input_00.ptr = pcVar10;
  capnp::compiler::lex(input_00,result,&local_428);
  orphanageParam = MessageBuilder::getOrphanage((MessageBuilder *)(local_2e8 + 0x30));
  capnp::compiler::CapnpParser::CapnpParser(&local_1c8,orphanageParam,&local_428);
  capnp::_::StructBuilder::asReader(&local_310);
  bVar12 = local_444 == 0;
  local_498 = local_450;
  if (bVar12) {
    local_498 = (Exception *)0x0;
  }
  uVar13 = 0x7fffffff;
  if (!bVar12) {
    uVar13 = local_440._0_4_;
  }
  local_4a8._0_4_ = 0;
  local_4a8._4_4_ = 0;
  uVar14 = 0;
  uVar15 = 0;
  if (!bVar12) {
    local_4a8._0_4_ = local_468.builder.segment._0_4_;
    local_4a8._4_4_ = local_468.builder.segment._4_4_;
    uVar14 = local_468.builder.capTable._0_4_;
    uVar15 = local_468.builder.capTable._4_4_;
  }
  stack0xfffffffffffffb60 = (SegmentBuilder *)CONCAT44(uVar15,uVar14);
  pWStack_490 = (WirePointer *)CONCAT44(pWStack_490._4_4_,uVar13);
  capnp::_::PointerReader::getList
            ((ListReader *)local_2e8,(PointerReader *)local_4a8,INLINE_COMPOSITE,(word *)0x0);
  local_468.builder.segment = (SegmentBuilder *)0x0;
  local_468.builder.pointer._0_4_ = 0;
  local_448 = local_2e8._24_4_;
  local_438 = 0;
  local_468.builder.capTable = (CapTableBuilder *)local_2e8;
  local_450 = (Exception *)local_2e8;
  local_440 = (Exception *)local_2e8;
  if (local_2e8._24_4_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)local_4a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x6d,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal((Fault *)local_4a8);
  }
  (*(code *)**(undefined8 **)local_1c8.parsers.expression.wrapper)
            ((DebugComparison<capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
              *)local_4a8,local_1c8.parsers.expression.wrapper,local_1c8.parsers.expression.parser,
             &local_468);
  local_3e8 = local_4a8[0];
  if (local_4a8[0] == '\x01') {
    local_3e0.segment = (SegmentBuilder *)local_498;
    local_3e0.capTable = (CapTableBuilder *)pWStack_490;
    local_3e0.location = (word *)local_488;
    local_3e0.tag.content = (uint64_t)stack0xfffffffffffffb60;
    local_4a8._0_8_ = local_468.builder.capTable;
    stack0xfffffffffffffb60 = (SegmentBuilder *)CONCAT44(uStack_49c,(uint)local_468.builder.pointer)
    ;
    pWStack_490 = (WirePointer *)CONCAT44(pWStack_490._4_4_,local_2e8._24_4_);
    local_488 = (WirePointer *)0x4d6514;
    sStack_480 = 5;
    local_478 = (uint)local_468.builder.pointer == local_2e8._24_4_;
    local_498 = (Exception *)local_2e8;
    if (!local_478) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>&,char_const(&)[23]>
                ((Fault *)&local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x61,FAILED,"parserInput.getPosition() == tokens.end()",
                 "_kjCondition,\"Extra tokens in input.\"",
                 (DebugComparison<capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                  *)local_4a8,(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal((Fault *)&local_378);
    }
    capnp::_::OrphanBuilder::asStructReader(&local_3a8,&local_3e0,(StructSize)0x20003);
    if (local_3a8.dataSize < 0x10) {
      local_410.resolver = (Resolver *)((ulong)local_410.resolver._1_7_ << 8);
    }
    else {
      local_410.resolver = (Resolver *)CONCAT71(local_410.resolver._1_7_,*local_3a8.data == 7);
      if (*local_3a8.data == 7) {
        local_348 = local_3a8.segment;
        uStack_340 = local_3a8.capTable;
        local_430 = local_3a8.pointers;
        local_3c0._vptr_ErrorReporter = (_func_int **)&PTR_addError_006d4ea0;
        local_3f0._vptr_Resolver = (_func_int **)&PTR_resolveConstant_006d4ee0;
        local_338.dataSize = output.builder.dataSize;
        local_338.pointerCount = output.builder.pointerCount;
        local_338._38_2_ = output.builder._38_2_;
        local_338.data = output.builder.data;
        local_338.pointers = output.builder.pointers;
        local_338.segment = output.builder.segment;
        local_338.capTable = output.builder.capTable;
        local_3b8 = pcVar10;
        local_3b0 = sVar8;
        pBVar6 = capnp::_::StructBuilder::getArena(&local_338);
        local_410.orphanage.capTable = capnp::_::StructBuilder::getCapTable(&local_338);
        local_410.resolver = &local_3f0;
        local_410.errorReporter = &local_3c0;
        local_4a8._0_8_ = output.schema.super_Schema.raw;
        stack0xfffffffffffffb60 = output.builder.segment;
        local_498 = (Exception *)output.builder.capTable;
        pWStack_490 = (WirePointer *)output.builder.data;
        local_488 = output.builder.pointers;
        sStack_480._0_4_ = output.builder.dataSize;
        sStack_480._4_2_ = output.builder.pointerCount;
        sStack_480._6_2_ = output.builder._38_2_;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        local_338.data = local_430;
        if (local_3a8.pointerCount == 0) {
          local_338.data = (WirePointer *)0x0;
        }
        iVar5 = 0x7fffffff;
        if (local_3a8.pointerCount != 0) {
          uVar13 = (undefined4)local_348;
          uVar14 = local_348._4_4_;
          uVar15 = (undefined4)uStack_340;
          uVar16 = uStack_340._4_4_;
          iVar5 = local_3a8.nestingLimit;
        }
        local_338.segment = (SegmentBuilder *)CONCAT44(uVar14,uVar13);
        local_338.capTable = (CapTableBuilder *)CONCAT44(uVar16,uVar15);
        local_338.pointers = (WirePointer *)CONCAT44(local_338.pointers._4_4_,iVar5);
        local_410.orphanage.arena = pBVar6;
        capnp::_::PointerReader::getList
                  (&local_378,(PointerReader *)&local_338,INLINE_COMPOSITE,(word *)0x0);
        builder.builder.segment = stack0xfffffffffffffb60;
        builder.schema.super_Schema.raw = (Schema)(Schema)local_4a8._0_8_;
        builder.builder.capTable = (CapTableBuilder *)local_498;
        builder.builder.data = pWStack_490;
        builder.builder.pointers = local_488;
        builder.builder.dataSize = (undefined4)sStack_480;
        builder.builder.pointerCount = sStack_480._4_2_;
        builder.builder._38_2_ = sStack_480._6_2_;
        assignments.reader.capTable = local_378.capTable;
        assignments.reader.segment = local_378.segment;
        assignments.reader.ptr = local_378.ptr;
        assignments.reader.elementCount = local_378.elementCount;
        assignments.reader.step = local_378.step;
        assignments.reader.structDataSize = local_378.structDataSize;
        assignments.reader.structPointerCount = local_378.structPointerCount;
        assignments.reader.elementSize = local_378.elementSize;
        assignments.reader._39_1_ = local_378._39_1_;
        assignments.reader.nestingLimit = local_378.nestingLimit;
        assignments.reader._44_4_ = local_378._44_4_;
        capnp::compiler::ValueTranslator::fillStructValue(&local_410,builder,assignments);
        goto LAB_003a7df9;
      }
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[33]>
              ((Fault *)&local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x88,FAILED,"expression.isTuple()",
               "_kjCondition,\"Input does not contain a struct.\"",
               (DebugExpression<bool> *)&local_410,(char (*) [33])"Input does not contain a struct."
              );
    kj::_::Debug::Fault::~Fault((Fault *)&local_338);
  }
  else {
    index = local_438;
    if (local_438 < (uint)local_468.builder.pointer) {
      index = (uint)local_468.builder.pointer;
    }
    if (index == local_2e8._24_4_) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)local_4a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x67,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal((Fault *)local_4a8);
    }
    capnp::_::ListReader::getStructElement
              ((StructReader *)local_4a8,
               *(ListReader **)
                ((long)&local_468 + (ulong)((uint)local_468.builder.pointer <= local_438) * 0x20 + 8
                ),index);
    uVar9 = 0;
    if ((uint)local_488 < 0x40) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)*(uint *)((long)&((SegmentReader *)&local_498->ownFile)->arena + 4);
      if (0x9f < (uint)local_488) {
        uVar9 = (ulong)*(uint *)&(((SegmentReader *)&local_498->ownFile)->ptr).ptr;
      }
    }
    (**local_428._vptr_ErrorReporter)(&local_428,uVar11,uVar9,"Parse error",0xc);
  }
LAB_003a7df9:
  if ((local_3e8 == '\x01') && ((Exception *)local_3e0.segment != (Exception *)0x0)) {
    capnp::_::OrphanBuilder::euthanize(&local_3e0);
  }
  if (local_468.builder.segment != (SegmentBuilder *)0x0) {
    uVar2 = local_438;
    ppwVar4 = (word **)&local_440;
    if (local_438 < (uint)local_468.builder.pointer) {
      uVar2 = (uint)local_468.builder.pointer;
      ppwVar4 = (word **)&local_468.builder.capTable;
    }
    uVar1 = *(uint *)&(local_468.builder.segment)->readOnly;
    uVar3 = uVar2;
    if (uVar2 <= uVar1) {
      uVar3 = uVar1;
    }
    ppwVar7 = &(local_468.builder.segment)->pos;
    if (uVar1 < uVar2) {
      ppwVar7 = ppwVar4;
    }
    (local_468.builder.segment)->pos = (word *)*ppwVar7;
    *(uint *)&(local_468.builder.segment)->readOnly = uVar3;
  }
  capnp::compiler::CapnpParser::~CapnpParser(&local_1c8);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)(local_2e8 + 0x30));
  return;
}

Assistant:

void TextCodec::decode(kj::StringPtr input, DynamicStruct::Builder output) const {
  lexAndParseExpression(input, [&](compiler::Expression::Reader expression) {
    KJ_REQUIRE(expression.isTuple(), "Input does not contain a struct.") { return; }

    ThrowingErrorReporter errorReporter(input);
    ExternalResolver nullResolver;

    Orphanage orphanage = Orphanage::getForMessageContaining(output);
    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    translator.fillStructValue(output, expression.getTuple());
  });
}